

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O0

void __thiscall
TTD::RuntimeContextInfo::EnqueueRootPathObject
          (RuntimeContextInfo *this,char16 *rootName,RecyclableObject *obj)

{
  bool bVar1;
  HeapAllocator *alloc;
  TTAutoString *this_00;
  TrackAllocData local_50;
  TTAutoString *local_28;
  TTAutoString *rootStr;
  RecyclableObject *obj_local;
  char16 *rootName_local;
  RuntimeContextInfo *this_local;
  
  rootStr = (TTAutoString *)obj;
  obj_local = (RecyclableObject *)rootName;
  rootName_local = (char16 *)this;
  JsUtil::Queue<Js::RecyclableObject_*,_Memory::HeapAllocator>::Enqueue
            (&this->m_worklist,(RecyclableObject **)&rootStr);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&UtilSupport::TTAutoString::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTRuntimeInfoTracker.cpp"
             ,0x376);
  alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_50);
  this_00 = (TTAutoString *)new<Memory::HeapAllocator>(0x18,alloc,true,0x469be0);
  UtilSupport::TTAutoString::TTAutoString(this_00,(char16 *)obj_local);
  local_28 = TTD_MEM_ALLOC_CHECK<TTD::UtilSupport::TTAutoString>(this_00);
  bVar1 = JsUtil::
          BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::ContainsKey(&this->m_coreObjToPathMap,(RecyclableObject **)&rootStr);
  if (!bVar1) {
    JsUtil::
    BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::AddNew(&this->m_coreObjToPathMap,(RecyclableObject **)&rootStr,&local_28);
    return;
  }
  TTDAbort_unrecoverable_error("Already in map!!!");
}

Assistant:

void RuntimeContextInfo::EnqueueRootPathObject(const char16* rootName, Js::RecyclableObject* obj)
    {
        this->m_worklist.Enqueue(obj);

        UtilSupport::TTAutoString* rootStr = TT_HEAP_NEW(UtilSupport::TTAutoString, rootName);

        TTDAssert(!this->m_coreObjToPathMap.ContainsKey(obj), "Already in map!!!");
        this->m_coreObjToPathMap.AddNew(obj, rootStr);
    }